

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::pumpTo(AsyncPipe *this,AsyncOutputStream *output,uint64_t amount)

{
  _func_int **pp_Var1;
  void *pvVar2;
  long in_RCX;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  if (in_RCX == 0) {
    constPromise<unsigned_long,_0UL>();
  }
  else {
    pp_Var1 = output[4]._vptr_AsyncOutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pvVar2 = operator_new(0x400);
      *(undefined8 *)((long)pvVar2 + 0x200) = 0;
      *(undefined ***)((long)pvVar2 + 0x1f0) = &PTR_destroy_00598dc8;
      *(undefined ***)((long)pvVar2 + 0x208) = &PTR_reject_00598e18;
      *(undefined1 *)((long)pvVar2 + 0x210) = 0;
      *(undefined1 *)((long)pvVar2 + 0x3a8) = 0;
      *(undefined1 *)((long)pvVar2 + 0x3b8) = 1;
      *(undefined ***)((long)pvVar2 + 0x3c0) = &PTR_read_00598e78;
      *(undefined ***)((long)pvVar2 + 0x3c8) = &PTR_write_00598f38;
      *(long *)((long)pvVar2 + 0x3d0) = (long)pvVar2 + 0x208;
      *(AsyncOutputStream **)((long)pvVar2 + 0x3d8) = output;
      *(uint64_t *)((long)pvVar2 + 0x3e0) = amount;
      *(long *)((long)pvVar2 + 1000) = in_RCX;
      *(undefined8 *)((long)pvVar2 + 0x3f0) = 0;
      *(undefined8 *)((long)pvVar2 + 0x3f8) = 0;
      output[4]._vptr_AsyncOutputStream = (_func_int **)((long)pvVar2 + 0x3c0);
      *(void **)((long)pvVar2 + 0x1f8) = pvVar2;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)((long)pvVar2 + 0x1f0);
      local_28.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
    }
    else {
      (**(code **)(*pp_Var1 + 0x18))(this,pp_Var1,amount);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
    if (amount == 0) {
      return constPromise<uint64_t, 0>();
    } else KJ_IF_SOME(s, state) {
      return s.pumpTo(output, amount);
    } else {
      return newAdaptedPromise<uint64_t, BlockedPumpTo>(*this, output, amount);
    }
  }